

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O2

bool __thiscall CaptureSummary::AddLine(CaptureSummary *this,CaptureLine *line,bool need_allocation)

{
  CaptureLine *__dest;
  undefined7 in_register_00000011;
  CaptureLine *local_20;
  
  __dest = line;
  if ((int)CONCAT71(in_register_00000011,need_allocation) != 0) {
    __dest = (CaptureLine *)operator_new(0xd0);
    memcpy(__dest,line,0xd0);
  }
  local_20 = __dest;
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::push_back
            (&this->summary,&local_20);
  return true;
}

Assistant:

bool CaptureSummary::AddLine(CaptureLine * line, bool need_allocation)
{
    bool ret = true;
    CaptureLine * new_line;

    if (need_allocation)
    {
        new_line = new CaptureLine;

        if (new_line == NULL)
        {
            ret = false;
        }
        else
        {
            memcpy(new_line, line, sizeof(CaptureLine));
        }
    }
    else
    {
        new_line = line;
    }

    if (ret)
    {
        summary.push_back(new_line);
    }

    return ret;
}